

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprBase * AnalyzeGenerator(ExpressionContext *ctx,SynGenerator *syntax)

{
  uint uVar1;
  Allocator *allocator;
  ScopeData *scope;
  TypeBase *pTVar2;
  IntrusiveList<ExprVariableDefinition> arguments_00;
  IntrusiveList<ExprBase> expressions_00;
  IntrusiveList<MatchData> generics;
  bool bVar3;
  SynIdentifier *pSVar4;
  FunctionData *pFVar5;
  TypeFunction *pTVar6;
  TypeRef *contextType;
  SynBase *pSVar7;
  ExprVariableDefinition *contextArgument;
  VariableData *this;
  ExprBase *pEVar8;
  ExprReturn *this_00;
  ExprBase *coroutineStateUpdate;
  ExprBase *closures;
  ExprFunctionDefinition *this_01;
  ExprFunctionAccess *this_02;
  char *pcVar9;
  ArrayView<ArgumentData> arguments_01;
  InplaceStr name;
  ExprFunctionAccess *local_8e0;
  InplaceStr local_770;
  ExprFunctionAccess *local_760;
  ExprBase *access;
  ExprBase *pEStack_750;
  IntrusiveList<ExprVariableDefinition> local_748;
  ExprVariableDefinition *local_738;
  ExprVariableDefinition *contextVariableDefinition;
  VariableData *contextVariable;
  VariableData *empty;
  SynBase *expression;
  SynIdentifier *local_708;
  SynIdentifier *nameIdentifier;
  undefined1 auStack_6f8 [4];
  uint offset;
  IntrusiveList<ExprBase> expressions;
  ExprBase *coroutineStateRead;
  ExprVariableDefinition *contextArgumentDefinition;
  IntrusiveList<MatchData> local_6c0;
  undefined1 local_6b0 [12];
  FunctionData *local_6a0;
  FunctionData *function;
  char *pcStack_690;
  SynIdentifier *local_680;
  SynIdentifier *functionNameIdentifier;
  Allocator *local_668;
  char *pcStack_660;
  TypeBase *local_650;
  TypeBase *contextClassType;
  SmallArray<ArgumentData,_32U> arguments;
  InplaceStr functionName;
  SynGenerator *syntax_local;
  ExpressionContext *ctx_local;
  
  join_0x00000010_0x00000000_ = GetTemporaryFunctionName(ctx);
  SmallArray<ArgumentData,_32U>::SmallArray
            ((SmallArray<ArgumentData,_32U> *)&contextClassType,ctx->allocator);
  local_668 = arguments.allocator;
  pcStack_660 = functionName.begin;
  local_650 = CreateFunctionContextType(ctx,&syntax->super_SynBase,stack0xffffffffffffffd0);
  pSVar4 = ExpressionContext::get<SynIdentifier>(ctx);
  function = (FunctionData *)arguments.allocator;
  pcStack_690 = functionName.begin;
  SynIdentifier::SynIdentifier(pSVar4,stack0xffffffffffffffd0);
  local_680 = pSVar4;
  pFVar5 = ExpressionContext::get<FunctionData>(ctx);
  allocator = ctx->allocator;
  scope = ctx->scope;
  pTVar2 = ctx->typeAuto;
  ArrayView<ArgumentData>::ArrayView<32u>
            ((ArrayView<ArgumentData> *)local_6b0,(SmallArray<ArgumentData,_32U> *)&contextClassType
            );
  arguments_01._12_4_ = 0;
  arguments_01.data = (ArgumentData *)local_6b0._0_8_;
  arguments_01.count = local_6b0._8_4_;
  pTVar6 = ExpressionContext::GetFunctionType(ctx,&syntax->super_SynBase,pTVar2,arguments_01);
  contextType = ExpressionContext::GetReferenceType(ctx,local_650);
  pSVar4 = local_680;
  IntrusiveList<MatchData>::IntrusiveList(&local_6c0);
  uVar1 = ctx->uniqueFunctionId;
  ctx->uniqueFunctionId = uVar1 + 1;
  pcVar9 = (char *)0x1;
  generics.tail = local_6c0.tail;
  generics.head = local_6c0.head;
  FunctionData::FunctionData
            (pFVar5,allocator,&syntax->super_SynBase,scope,true,false,false,pTVar6,
             &contextType->super_TypeBase,pSVar4,generics,uVar1);
  name.end = pcVar9;
  name.begin = (pFVar5->name->name).end;
  local_6a0 = pFVar5;
  anon_unknown.dwarf_8df1c::CheckFunctionConflict
            ((anon_unknown_dwarf_8df1c *)ctx,(ExpressionContext *)syntax,
             (SynBase *)(pFVar5->name->name).begin,name);
  ExpressionContext::AddFunction(ctx,local_6a0);
  ExpressionContext::PushScope(ctx,local_6a0);
  local_6a0->functionScope = ctx->scope;
  pSVar7 = &ExpressionContext::MakeInternal(ctx,&syntax->super_SynBase)->super_SynBase;
  contextArgument = CreateFunctionContextArgument(ctx,pSVar7,local_6a0);
  local_6a0->argumentsSize = local_6a0->functionScope->dataSize;
  expressions.tail = (ExprBase *)0x0;
  IntrusiveList<ExprBase>::IntrusiveList((IntrusiveList<ExprBase> *)auStack_6f8);
  if ((local_6a0->coroutine & 1U) != 0) {
    nameIdentifier._4_4_ =
         anon_unknown.dwarf_8df1c::AllocateVariableInScope
                   (ctx,&syntax->super_SynBase,ctx->typeInt->alignment,ctx->typeInt);
    pSVar4 = ExpressionContext::get<SynIdentifier>(ctx);
    InplaceStr::InplaceStr((InplaceStr *)&expression,"$jmpOffset");
    SynIdentifier::SynIdentifier(pSVar4,_expression);
    local_708 = pSVar4;
    this = ExpressionContext::get<VariableData>(ctx);
    uVar1 = ctx->uniqueVariableId;
    ctx->uniqueVariableId = uVar1 + 1;
    VariableData::VariableData
              (this,ctx->allocator,&syntax->super_SynBase,ctx->scope,0,ctx->typeInt,local_708,
               nameIdentifier._4_4_,uVar1);
    local_6a0->coroutineJumpOffset = this;
    bVar3 = anon_unknown.dwarf_8df1c::IsLookupOnlyVariable(ctx,local_6a0->coroutineJumpOffset);
    if (bVar3) {
      local_6a0->coroutineJumpOffset->lookupOnly = true;
    }
    ExpressionContext::AddVariable(ctx,local_6a0->coroutineJumpOffset,false);
    AddFunctionCoroutineVariable
              (ctx,&syntax->super_SynBase,local_6a0,local_6a0->coroutineJumpOffset);
    expressions.tail =
         CreateVariableAccess(ctx,&syntax->super_SynBase,local_6a0->coroutineJumpOffset,true);
  }
  for (empty = (VariableData *)(syntax->expressions).head; empty != (VariableData *)0x0;
      empty = *(VariableData **)&empty->nameHash) {
    pEVar8 = AnalyzeStatement(ctx,(SynBase *)empty);
    IntrusiveList<ExprBase>::push_back((IntrusiveList<ExprBase> *)auStack_6f8,pEVar8);
  }
  if ((local_6a0->hasExplicitReturn & 1U) == 0) {
    anon_unknown.dwarf_8df1c::Report
              (ctx,&syntax->super_SynBase,
               "ERROR: not a single element is generated, and an array element type is unknown");
  }
  else if (local_6a0->type->returnType == ctx->typeVoid) {
    anon_unknown.dwarf_8df1c::Report
              (ctx,&syntax->super_SynBase,"ERROR: cannot generate an array of \'void\' element type"
              );
  }
  else {
    contextVariable =
         anon_unknown.dwarf_8df1c::AllocateTemporary
                   (ctx,&syntax->super_SynBase,local_6a0->type->returnType);
    this_00 = ExpressionContext::get<ExprReturn>(ctx);
    pTVar2 = ctx->typeVoid;
    pEVar8 = CreateVariableAccess(ctx,&syntax->super_SynBase,contextVariable,false);
    coroutineStateUpdate =
         CreateFunctionCoroutineStateUpdate(ctx,&syntax->super_SynBase,local_6a0,0);
    pSVar7 = &ExpressionContext::MakeInternal(ctx,&syntax->super_SynBase)->super_SynBase;
    closures = CreateFunctionUpvalueClose(ctx,pSVar7,local_6a0,ctx->scope);
    ExprReturn::ExprReturn
              (this_00,&syntax->super_SynBase,pTVar2,pEVar8,coroutineStateUpdate,closures);
    IntrusiveList<ExprBase>::push_back
              ((IntrusiveList<ExprBase> *)auStack_6f8,&this_00->super_ExprBase);
  }
  ClosePendingUpvalues(ctx,local_6a0);
  ExpressionContext::PopScope(ctx,SCOPE_FUNCTION);
  contextVariableDefinition =
       (ExprVariableDefinition *)
       CreateFunctionContextVariable(ctx,&syntax->super_SynBase,local_6a0,(FunctionData *)0x0);
  local_738 = CreateFunctionContextVariableDefinition
                        (ctx,&syntax->super_SynBase,local_6a0,(FunctionData *)0x0,
                         (VariableData *)contextVariableDefinition);
  this_01 = ExpressionContext::get<ExprFunctionDefinition>(ctx);
  pFVar5 = local_6a0;
  pTVar6 = local_6a0->type;
  IntrusiveList<ExprVariableDefinition>::IntrusiveList(&local_748);
  access = _auStack_6f8;
  pEStack_750 = expressions.head;
  arguments_00.tail._0_4_ = (int)local_748.tail;
  arguments_00.head = local_748.head;
  arguments_00.tail._4_4_ = (int)((ulong)local_748.tail >> 0x20);
  expressions_00.tail = expressions.head;
  expressions_00.head = _auStack_6f8;
  ExprFunctionDefinition::ExprFunctionDefinition
            (this_01,&syntax->super_SynBase,&pTVar6->super_TypeBase,pFVar5,contextArgument,
             arguments_00,expressions.tail,expressions_00,local_738,
             (VariableData *)contextVariableDefinition);
  local_6a0->declaration = &this_01->super_ExprBase;
  SmallArray<ExprBase_*,_128U>::push_back(&ctx->definitions,&local_6a0->declaration);
  this_02 = ExpressionContext::get<ExprFunctionAccess>(ctx);
  pFVar5 = local_6a0;
  pTVar6 = local_6a0->type;
  pEVar8 = CreateFunctionContextAccess(ctx,&syntax->super_SynBase,local_6a0);
  ExprFunctionAccess::ExprFunctionAccess
            (this_02,&syntax->super_SynBase,&pTVar6->super_TypeBase,pFVar5,pEVar8);
  local_760 = this_02;
  InplaceStr::InplaceStr(&local_770,"__gen_list");
  if (local_738 == (ExprVariableDefinition *)0x0) {
    local_8e0 = local_760;
  }
  else {
    local_8e0 = (ExprFunctionAccess *)
                CreateSequence(ctx,&syntax->super_SynBase,&local_738->super_ExprBase,
                               &local_760->super_ExprBase);
  }
  pEVar8 = CreateFunctionCall1(ctx,&syntax->super_SynBase,local_770,&local_8e0->super_ExprBase,false
                               ,true,true);
  SmallArray<ArgumentData,_32U>::~SmallArray((SmallArray<ArgumentData,_32U> *)&contextClassType);
  return pEVar8;
}

Assistant:

ExprBase* AnalyzeGenerator(ExpressionContext &ctx, SynGenerator *syntax)
{
	InplaceStr functionName = GetTemporaryFunctionName(ctx);

	SmallArray<ArgumentData, 32> arguments(ctx.allocator);

	TypeBase *contextClassType = CreateFunctionContextType(ctx, syntax, functionName);

	SynIdentifier *functionNameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(functionName);

	FunctionData *function = new (ctx.get<FunctionData>()) FunctionData(ctx.allocator, syntax, ctx.scope, true, false, false, ctx.GetFunctionType(syntax, ctx.typeAuto, arguments), ctx.GetReferenceType(contextClassType), functionNameIdentifier, IntrusiveList<MatchData>(), ctx.uniqueFunctionId++);

	CheckFunctionConflict(ctx, syntax, function->name->name);

	ctx.AddFunction(function);

	ctx.PushScope(function);

	function->functionScope = ctx.scope;

	ExprVariableDefinition *contextArgumentDefinition = CreateFunctionContextArgument(ctx, ctx.MakeInternal(syntax), function);

	function->argumentsSize = function->functionScope->dataSize;

	ExprBase *coroutineStateRead = NULL;

	IntrusiveList<ExprBase> expressions;

	if(function->coroutine)
	{
		unsigned offset = AllocateVariableInScope(ctx, syntax, ctx.typeInt->alignment, ctx.typeInt);

		SynIdentifier *nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr("$jmpOffset"));

		function->coroutineJumpOffset = new (ctx.get<VariableData>()) VariableData(ctx.allocator, syntax, ctx.scope, 0, ctx.typeInt, nameIdentifier, offset, ctx.uniqueVariableId++);

		if (IsLookupOnlyVariable(ctx, function->coroutineJumpOffset))
			function->coroutineJumpOffset->lookupOnly = true;

		ctx.AddVariable(function->coroutineJumpOffset, false);

		AddFunctionCoroutineVariable(ctx, syntax, function, function->coroutineJumpOffset);

		coroutineStateRead = CreateVariableAccess(ctx, syntax, function->coroutineJumpOffset, true);
	}

	for(SynBase *expression = syntax->expressions.head; expression; expression = expression->next)
		expressions.push_back(AnalyzeStatement(ctx, expression));

	if(!function->hasExplicitReturn)
	{
		Report(ctx, syntax, "ERROR: not a single element is generated, and an array element type is unknown");
	}
	else if(function->type->returnType == ctx.typeVoid)
	{
		Report(ctx, syntax, "ERROR: cannot generate an array of 'void' element type");
	}
	else
	{
		VariableData *empty = AllocateTemporary(ctx, syntax, function->type->returnType);

		expressions.push_back(new (ctx.get<ExprReturn>()) ExprReturn(syntax, ctx.typeVoid, CreateVariableAccess(ctx, syntax, empty, false), CreateFunctionCoroutineStateUpdate(ctx, syntax, function, 0), CreateFunctionUpvalueClose(ctx, ctx.MakeInternal(syntax), function, ctx.scope)));
	}

	ClosePendingUpvalues(ctx, function);

	ctx.PopScope(SCOPE_FUNCTION);

	VariableData *contextVariable = CreateFunctionContextVariable(ctx, syntax, function, NULL);
	ExprVariableDefinition *contextVariableDefinition = CreateFunctionContextVariableDefinition(ctx, syntax, function, NULL, contextVariable);

	function->declaration = new (ctx.get<ExprFunctionDefinition>()) ExprFunctionDefinition(syntax, function->type, function, contextArgumentDefinition, IntrusiveList<ExprVariableDefinition>(), coroutineStateRead, expressions, contextVariableDefinition, contextVariable);

	ctx.definitions.push_back(function->declaration);

	ExprBase *access = new (ctx.get<ExprFunctionAccess>()) ExprFunctionAccess(syntax, function->type, function, CreateFunctionContextAccess(ctx, syntax, function));

	return CreateFunctionCall1(ctx, syntax, InplaceStr("__gen_list"), contextVariableDefinition ? CreateSequence(ctx, syntax, contextVariableDefinition, access) : access, false, true, true);
}